

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureDescWrapper::
AddImmutableSampler<Diligent::ImmutableSamplerDesc_const&>
          (PipelineResourceSignatureDescWrapper *this,ImmutableSamplerDesc *Args)

{
  char *pcVar1;
  uint uVar2;
  ImmutableSamplerDesc *pIVar3;
  Char *pCVar4;
  vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_> *this_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar5;
  allocator local_59;
  value_type local_58;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_38;
  undefined1 local_30;
  reference local_28;
  ImmutableSamplerDesc *ImtblSam;
  ImmutableSamplerDesc *local_18;
  ImmutableSamplerDesc *Args_local;
  PipelineResourceSignatureDescWrapper *this_local;
  
  this_00 = &this->m_ImmutableSamplers;
  local_18 = Args;
  Args_local = (ImmutableSamplerDesc *)this;
  std::vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>::
  emplace_back<Diligent::ImmutableSamplerDesc_const&>
            ((vector<Diligent::ImmutableSamplerDesc,std::allocator<Diligent::ImmutableSamplerDesc>>
              *)this_00,Args);
  ImtblSam = (ImmutableSamplerDesc *)
             std::
             vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ::size(this_00);
  uVar2 = StaticCast<unsigned_int,unsigned_long>((unsigned_long *)&ImtblSam);
  (this->m_Desc).NumImmutableSamplers = uVar2;
  pIVar3 = std::
           vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>::
           data(this_00);
  (this->m_Desc).ImmutableSamplers = pIVar3;
  local_28 = std::
             vector<Diligent::ImmutableSamplerDesc,_std::allocator<Diligent::ImmutableSamplerDesc>_>
             ::back(this_00);
  pcVar1 = local_28->SamplerOrTextureName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,pcVar1,&local_59);
  pVar5 = std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->m_StringPool,&local_58);
  local_38._M_cur =
       (__node_type *)
       pVar5.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_30 = pVar5.second;
  std::__detail::
  _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
  ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                *)&local_38);
  pCVar4 = (Char *)std::__cxx11::string::c_str();
  local_28->SamplerOrTextureName = pCVar4;
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return;
}

Assistant:

void AddImmutableSampler(ArgsType&&... Args)
    {
        m_ImmutableSamplers.emplace_back(std::forward<ArgsType>(Args)...);
        m_Desc.NumImmutableSamplers = StaticCast<Uint32>(m_ImmutableSamplers.size());
        m_Desc.ImmutableSamplers    = m_ImmutableSamplers.data();

        ImmutableSamplerDesc& ImtblSam{m_ImmutableSamplers.back()};
        ImtblSam.SamplerOrTextureName = m_StringPool.insert(ImtblSam.SamplerOrTextureName).first->c_str();
    }